

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

wchar_t menu_add_options(nh_menuitem **items,int *size,int *icount,wchar_t listid,
                        nh_option_desc *options,nh_bool read_only)

{
  int iVar1;
  uint uVar2;
  nh_menuitem *pnVar3;
  int iVar4;
  uint uVar5;
  char optbuf [256];
  char local_138 [264];
  
  uVar5 = 0;
  for (; options->name != (char *)0x0; options = options + 1) {
    print_option_string(options,local_138);
    iVar4 = *icount;
    iVar1 = *size;
    uVar2 = listid << 10 | uVar5;
    if (read_only != '\0') {
      uVar2 = 0;
    }
    pnVar3 = *items;
    if (iVar1 <= iVar4) {
      *size = iVar1 * 2;
      pnVar3 = (nh_menuitem *)realloc(pnVar3,(long)iVar1 * 0x218);
      *items = pnVar3;
      iVar4 = *icount;
    }
    pnVar3 = pnVar3 + iVar4;
    pnVar3->id = uVar2;
    pnVar3->role = (uint)(read_only == '\0');
    pnVar3->accel = '\0';
    pnVar3->group_accel = '\0';
    pnVar3->selected = '\0';
    strcpy(pnVar3->caption,local_138);
    *icount = *icount + 1;
    uVar5 = uVar5 + 1;
  }
  iVar4 = *icount;
  iVar1 = *size;
  pnVar3 = *items;
  if (iVar1 <= iVar4) {
    *size = iVar1 * 2;
    pnVar3 = (nh_menuitem *)realloc(pnVar3,(long)iVar1 * 0x218);
    *items = pnVar3;
    iVar4 = *icount;
  }
  pnVar3[iVar4].accel = '\0';
  pnVar3[iVar4].group_accel = '\0';
  pnVar3[iVar4].selected = '\0';
  pnVar3[iVar4].id = 0;
  pnVar3[iVar4].role = MI_TEXT;
  pnVar3[iVar4].caption[0] = '\0';
  *icount = *icount + 1;
  return (wchar_t)pnVar3;
}

Assistant:

static int menu_add_options(struct nh_menuitem **items, int *size, int *icount,
	    int listid, struct nh_option_desc *options, nh_bool read_only)
{
    int i, id;
    char optbuf[256];
    
    for (i = 0; options[i].name; i++) {
	id = (listid << 10) | i;
	print_option_string(&options[i], optbuf);
	if (read_only)
	    add_menu_txt(*items, *size, *icount, optbuf, MI_TEXT);
	else
	    add_menu_item(*items, *size, *icount, id, optbuf, 0, 0);
    }
    
    /* add an empty line */
    add_menu_txt(*items, *size, *icount, "", MI_TEXT);
    
    return i;
}